

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cpp
# Opt level: O3

Module * mocker::buildIR(Module *__return_storage_ptr__,shared_ptr<mocker::ast::ASTRoot> *ast,
                        SemanticContext *semanticCtx)

{
  FuncsMap *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  size_t sVar4;
  undefined4 uVar5;
  Module *__x;
  BBLIter BVar6;
  shared_ptr<mocker::ast::ASTRoot> *ast_00;
  BasicBlock *pBVar7;
  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
  *exprType;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  shared_ptr<mocker::ir::Reg> funcRes;
  shared_ptr<mocker::ir::Reg> ptr;
  shared_ptr<mocker::ir::Reg> tmp;
  __alloc_node_gen_t __alloc_node_gen;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  redundantNode;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pureFuncs;
  BuilderContext IRCtx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  OpType local_568;
  undefined1 local_561;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [24];
  undefined1 local_528 [32];
  string local_508;
  string local_4e8;
  string local_4c8;
  shared_ptr<mocker::ir::IRInst> local_4a8;
  shared_ptr<mocker::ir::IRInst> local_498;
  shared_ptr<mocker::ir::IRInst> local_488;
  shared_ptr<mocker::ir::IRInst> local_478;
  shared_ptr<mocker::ir::IRInst> local_468;
  shared_ptr<mocker::ir::IRInst> local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  FunctionModule local_418;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_340;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_308;
  element_type *local_2d0;
  BBLIter local_2c8;
  undefined1 local_270 [136];
  undefined1 local_1e8 [160];
  undefined1 local_148 [112];
  undefined1 local_d8 [80];
  undefined1 local_88 [88];
  
  exprType = &semanticCtx->exprType;
  renameASTIdentifiers(ast,&semanticCtx->scopeResiding,&semanticCtx->associatedDecl,exprType);
  findPureFunctions_abi_cxx11_
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_308,(mocker *)ast,ast_00);
  local_2d0 = (ast->super___shared_ptr<mocker::ast::ASTRoot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_2c8._M_node =
       (_List_node_base *)
       (ast->super___shared_ptr<mocker::ast::ASTRoot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_node !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_node)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_node)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_node)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_node)->_M_use_count + 1;
    }
  }
  findRedundantNodes((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&local_340,(shared_ptr<mocker::ast::ASTNode> *)&local_2d0,exprType,
                     (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_308);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_node !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_node);
  }
  ir::BuilderContext::BuilderContext
            ((BuilderContext *)&local_2d0,exprType,
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)&local_340);
  peVar3 = (ast->super___shared_ptr<mocker::ast::ASTRoot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_418.identifier._M_dataplus._M_p = (pointer)&PTR_operator___001ea108;
  local_418.identifier._M_string_length = (size_type)&local_2d0;
  (*(peVar3->super_ASTNode)._vptr_ASTNode[3])(peVar3,&local_418);
  __x = ir::BuilderContext::getResult((BuilderContext *)&local_2d0);
  std::__cxx11::list<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::list
            (&__return_storage_ptr__->globalVars,&__x->globalVars);
  this = &__return_storage_ptr__->funcs;
  (__return_storage_ptr__->funcs)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->funcs)._M_h._M_bucket_count = (__x->funcs)._M_h._M_bucket_count;
  (__return_storage_ptr__->funcs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->funcs)._M_h._M_element_count = (__x->funcs)._M_h._M_element_count;
  uVar5 = *(undefined4 *)&(__x->funcs)._M_h._M_rehash_policy.field_0x4;
  sVar4 = (__x->funcs)._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->funcs)._M_h._M_rehash_policy._M_max_load_factor =
       (__x->funcs)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->funcs)._M_h._M_rehash_policy.field_0x4 = uVar5;
  (__return_storage_ptr__->funcs)._M_h._M_rehash_policy._M_next_resize = sVar4;
  (__return_storage_ptr__->funcs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_418.identifier._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::ir::FunctionModule>,std::allocator<std::pair<std::__cxx11::string_const,mocker::ir::FunctionModule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::ir::FunctionModule>,std::allocator<std::pair<std::__cxx11::string_const,mocker::ir::FunctionModule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,mocker::ir::FunctionModule>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::ir::FunctionModule>,std::allocator<std::pair<std::__cxx11::string_const,mocker::ir::FunctionModule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&(__x->funcs)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>_>_>
              *)&local_418);
  local_540._16_8_ = this;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"#_array_#size","");
  paVar1 = &local_588.field_2;
  local_588._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"ptr","");
  __l._M_len = 1;
  __l._M_array = &local_588;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_430,__l,(allocator_type *)local_550);
  ir::FunctionModule::FunctionModule(&local_418,&local_4c8,&local_430,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar1) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  BVar6 = ir::FunctionModule::pushBackBB(&local_418);
  local_550._0_8_ = (Reg *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Reg,std::allocator<mocker::ir::Reg>,char_const(&)[2]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_550 + 8),(Reg **)local_550,
             (allocator<mocker::ir::Reg> *)&local_588,(char (*) [2])0x1ae153);
  local_588._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_540,&local_418.identifier);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar1) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_568 = Sub;
  local_560._8_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_560._0_8_ = local_560._8_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_560._8_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&PTR__Addr_001e9db0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_560._8_8_ + 0x10))->_M_use_count = 8;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_560._8_8_ + 0x10))->_M_weak_count = 0;
  local_588._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_588._M_string_length,
             (ArithBinaryInst **)&local_588,(allocator<mocker::ir::ArithBinaryInst> *)&local_561,
             (shared_ptr<mocker::ir::Reg> *)local_540,&local_568,
             (shared_ptr<mocker::ir::Reg> *)local_550,
             (shared_ptr<mocker::ir::IntLiteral> *)local_560);
  pBVar7 = (BasicBlock *)(BVar6._M_node + 1);
  local_458.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_588._M_dataplus._M_p;
  local_458.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length;
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  ir::BasicBlock::appendInst(pBVar7,&local_458);
  if (local_458.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
  }
  local_588._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_560,&local_418.identifier);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar1) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_588._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_588._M_string_length,
             (Load **)&local_588,(allocator<mocker::ir::Load> *)&local_568,
             (shared_ptr<mocker::ir::Reg> *)local_560,(shared_ptr<mocker::ir::Reg> *)local_540);
  local_468.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_588._M_dataplus._M_p;
  local_468.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length;
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  ir::BasicBlock::appendInst(pBVar7,&local_468);
  if (local_468.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_468.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length);
  }
  local_588._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Ret,std::allocator<mocker::ir::Ret>,std::shared_ptr<mocker::ir::Reg>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_588._M_string_length,
             (Ret **)&local_588,(allocator<mocker::ir::Ret> *)&local_568,
             (shared_ptr<mocker::ir::Reg> *)local_560);
  local_478.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_588._M_dataplus._M_p;
  local_478.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length;
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  ir::BasicBlock::appendInst(pBVar7,&local_478);
  if (local_478.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length);
  }
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,local_418.identifier._M_dataplus._M_p,
             &((LogicalExprInfo *)local_418.identifier._M_string_length)->empty +
             (long)local_418.identifier._M_dataplus._M_p);
  ir::Module::overwriteFunc(__return_storage_ptr__,&local_4e8,&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_540._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_540._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_418.predecessors._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_418.bbMap._M_h);
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_418.bbs.
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_418.args);
  paVar2 = &local_418.identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.identifier._M_dataplus._M_p != paVar2) {
    operator_delete(local_418.identifier._M_dataplus._M_p,
                    local_418.identifier.field_2._M_allocated_capacity + 1);
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"#string#length","");
  local_588._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"ptr","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_588;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_448,__l_00,(allocator_type *)local_550);
  ir::FunctionModule::FunctionModule(&local_418,&local_508,&local_448,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar1) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  BVar6 = ir::FunctionModule::pushBackBB(&local_418);
  local_550._0_8_ = (Reg *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Reg,std::allocator<mocker::ir::Reg>,char_const(&)[2]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_550 + 8),(Reg **)local_550,
             (allocator<mocker::ir::Reg> *)&local_588,(char (*) [2])0x1ae153);
  local_588._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_540,&local_418.identifier);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar1) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_568 = Sub;
  local_560._8_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_560._0_8_ = local_560._8_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_560._8_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&PTR__Addr_001e9db0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_560._8_8_ + 0x10))->_M_use_count = 8;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_560._8_8_ + 0x10))->_M_weak_count = 0;
  local_588._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_588._M_string_length,
             (ArithBinaryInst **)&local_588,(allocator<mocker::ir::ArithBinaryInst> *)&local_561,
             (shared_ptr<mocker::ir::Reg> *)local_540,&local_568,
             (shared_ptr<mocker::ir::Reg> *)local_550,
             (shared_ptr<mocker::ir::IntLiteral> *)local_560);
  pBVar7 = (BasicBlock *)(BVar6._M_node + 1);
  local_488.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_588._M_dataplus._M_p;
  local_488.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length;
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  ir::BasicBlock::appendInst(pBVar7,&local_488);
  if (local_488.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_488.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
  }
  local_588._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_560,&local_418.identifier);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar1) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_588._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_588._M_string_length,
             (Load **)&local_588,(allocator<mocker::ir::Load> *)&local_568,
             (shared_ptr<mocker::ir::Reg> *)local_560,(shared_ptr<mocker::ir::Reg> *)local_540);
  local_498.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_588._M_dataplus._M_p;
  local_498.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length;
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  ir::BasicBlock::appendInst(pBVar7,&local_498);
  if (local_498.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length);
  }
  local_588._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Ret,std::allocator<mocker::ir::Ret>,std::shared_ptr<mocker::ir::Reg>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_588._M_string_length,
             (Ret **)&local_588,(allocator<mocker::ir::Ret> *)&local_568,
             (shared_ptr<mocker::ir::Reg> *)local_560);
  local_4a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_588._M_dataplus._M_p;
  local_4a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length;
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  ir::BasicBlock::appendInst(pBVar7,&local_4a8);
  if (local_4a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._M_string_length);
  }
  local_528._0_8_ = local_540 + 0x28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_540 + 0x18),local_418.identifier._M_dataplus._M_p,
             &((LogicalExprInfo *)local_418.identifier._M_string_length)->empty +
             (long)local_418.identifier._M_dataplus._M_p);
  ir::Module::overwriteFunc(__return_storage_ptr__,(string *)(local_540 + 0x18),&local_418);
  if ((undefined1 *)local_528._0_8_ != local_540 + 0x28) {
    operator_delete((void *)local_528._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_528._16_8_)->_M_p + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_540._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_540._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_418.predecessors._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_418.bbMap._M_h);
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_418.bbs.
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_418.args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.identifier._M_dataplus._M_p != paVar2) {
    operator_delete(local_418.identifier._M_dataplus._M_p,
                    local_418.identifier.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_88);
  std::__cxx11::_List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::_M_clear
            ((_List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_> *)
             (local_d8 + 0x38));
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_148 + 0x38));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::BuilderContext::ClassLayout>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::BuilderContext::ClassLayout>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::BuilderContext::ClassLayout>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::BuilderContext::ClassLayout>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_148);
  std::
  deque<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>::
  ~deque((deque<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
          *)(local_1e8 + 0x50));
  std::
  deque<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>::
  ~deque((deque<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
          *)local_1e8);
  std::
  deque<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>::
  ~deque((deque<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
          *)(local_270 + 0x38));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_270);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&stack0xfffffffffffffd50);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_340);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_308);
  return __return_storage_ptr__;
}

Assistant:

ir::Module buildIR(const std::shared_ptr<ast::ASTRoot> &ast,
                   const SemanticContext &semanticCtx) {
  renameASTIdentifiers(ast, semanticCtx.scopeResiding,
                       semanticCtx.associatedDecl, semanticCtx.exprType);
  auto pureFuncs = findPureFunctions(ast);
  auto redundantNode = findRedundantNodes(ast, semanticCtx.exprType, pureFuncs);

  ir::BuilderContext IRCtx(semanticCtx.exprType, redundantNode);
  ast->accept(ir::Builder(IRCtx));
  auto res = IRCtx.getResult();

  // TODO: In current version, function inline must be enabled.
  // implement some simple builtin functions
  { // #_array_#size
    ir::FunctionModule func("#_array_#size", {"ptr"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Sub, ptr,
        std::make_shared<ir::IntLiteral>(8)));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(funcRes, tmp));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  { // #string#length
    ir::FunctionModule func("#string#length", {"ptr"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Sub, ptr,
        std::make_shared<ir::IntLiteral>(8)));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(funcRes, tmp));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  /*
  { // #string#ord ( this pos )
    ir::FunctionModule func("#string#ord", {"ptr", "pos"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto pos = std::make_shared<ir::Reg>("1");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Add, ptr, pos));
    auto loadRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(loadRes, tmp));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        funcRes, ir::ArithBinaryInst::BitAnd, loadRes,
        std::make_shared<ir::IntLiteral>(255)));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  */
  return res;
}